

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O2

void __thiscall Mine::Mine(Mine *this,string *n,int t,int spT)

{
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)n);
  Holding::Holding(&this->super_Holding,&sStack_48,t,spT,5,3);
  std::__cxx11::string::~string((string *)&sStack_48);
  (this->super_Holding).super_BlackCard.super_Card._vptr_Card =
       (_func_int **)&PTR_effectBonus_00116b18;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->cost = 5;
  this->tapped = false;
  this->revealed = false;
  this->harvestValue = 3;
  this->upperHolding = (Holding *)0x0;
  this->subHolding = (Holding *)0x0;
  return;
}

Assistant:

Mine::Mine(string n, int t, int spT) : Holding{n, t, spT, 5, 3}
{
    name = n;
    cost = 5;
    tapped = false;
    revealed = false;
    harvestValue = 3;

    upperHolding = nullptr;
    subHolding = nullptr;
}